

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editing_commands.cpp
# Opt level: O2

bool ungroup_active_proc(Am_Object *self)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Object obj;
  Am_Object selection_widget;
  Am_Value_List selected_objs;
  Am_Value is_group;
  Am_Object local_38;
  
  Am_Object::Am_Object(&local_38,self);
  Am_Get_Selection_Widget_For_Command(&selection_widget);
  Am_Object::~Am_Object(&local_38);
  bVar1 = Am_Object::Valid(&selection_widget);
  if (bVar1) {
    pAVar2 = Am_Object::Get(&selection_widget,0x169,0);
    Am_Value_List::Am_Value_List(&selected_objs,pAVar2);
    bVar1 = Am_Value_List::Empty(&selected_objs);
    if (bVar1) {
      bVar1 = false;
    }
    else {
      obj.data = (Am_Object_Data *)0x0;
      is_group.type = 0;
      is_group.value.wrapper_value = (Am_Wrapper *)0x0;
      Am_Value_List::Start(&selected_objs);
      while( true ) {
        bVar1 = Am_Value_List::Last(&selected_objs);
        if (bVar1) break;
        pAVar2 = Am_Value_List::Get(&selected_objs);
        Am_Object::operator=(&obj,pAVar2);
        pAVar2 = Am_Object::Get(&obj,0x1e6,5);
        Am_Value::operator=(&is_group,pAVar2);
        bVar1 = Am_Value::Valid(&is_group);
        if (!bVar1) {
          bVar1 = false;
          goto LAB_00241e8c;
        }
        Am_Value_List::Next(&selected_objs);
      }
      bVar1 = Am_Check_All_Objects_For_Inactive_Slot(&selected_objs,self);
LAB_00241e8c:
      Am_Value::~Am_Value(&is_group);
      Am_Object::~Am_Object(&obj);
    }
    Am_Value_List::~Am_Value_List(&selected_objs);
  }
  else {
    bVar1 = false;
  }
  Am_Object::~Am_Object(&selection_widget);
  return bVar1;
}

Assistant:

Am_Define_Formula(bool, ungroup_active)
{
  Am_Object selection_widget = Am_Get_Selection_Widget_For_Command(self);
  if (selection_widget.Valid()) {
    Am_Value_List selected_objs = selection_widget.Get(Am_VALUE);
    if (selected_objs.Empty())
      return false;
    Am_Object obj;
    Am_Value is_group;
    for (selected_objs.Start(); !selected_objs.Last(); selected_objs.Next()) {
      obj = selected_objs.Get();
      is_group = obj.Peek(Am_CREATED_GROUP,
                          Am_NO_DEPENDENCY); //don't need GV since won't change
      if (!is_group.Valid())
        return false;
    }
    return Am_Check_All_Objects_For_Inactive_Slot(selected_objs, self);
  } else
    return false;
}